

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall Cache::initCache(Cache *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  vector<Cache::Block,_std::allocator<Cache::Block>_> *this_00;
  allocator_type *__a;
  allocator_type *paVar3;
  ulong uVar4;
  void *pvVar5;
  size_type in_RDI;
  uint32_t j_1;
  uint32_t i_2;
  uint32_t j;
  uint32_t i_1;
  Block *b;
  uint32_t i;
  vector<Cache::Block,_std::allocator<Cache::Block>_> *in_stack_ffffffffffffff68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  allocator_type *in_stack_ffffffffffffff70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_59;
  reference local_40;
  uint local_38;
  
  this_00 = (vector<Cache::Block,_std::allocator<Cache::Block>_> *)(ulong)*(uint *)(in_RDI + 0x38);
  std::allocator<Cache::Block>::allocator((allocator<Cache::Block> *)0x1042f6);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::vector
            (this_00,in_RDI,in_stack_ffffffffffffff70);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator=
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)in_stack_ffffffffffffff70);
  std::allocator<Cache::Block>::~allocator((allocator<Cache::Block> *)0x10433f);
  local_38 = 0;
  while( true ) {
    __a = (allocator_type *)(ulong)local_38;
    paVar3 = (allocator_type *)
             std::vector<Cache::Block,_std::allocator<Cache::Block>_>::size
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x18));
    if (paVar3 <= __a) break;
    local_40 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI + 0x18),
                          (ulong)local_38);
    local_40->size = *(uint32_t *)(in_RDI + 0x34);
    local_40->id = local_38 / *(uint *)(in_RDI + 0x3c);
    __x = &local_59;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1043c9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,in_RDI,__a);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a,__x);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x104406);
    local_38 = local_38 + 1;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)*(uint *)(in_RDI + 0x38) / (ulong)*(uint *)(in_RDI + 0x3c);
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *(void **)(in_RDI + 0x48) = pvVar5;
  for (local_60 = 0; local_60 < *(uint *)(in_RDI + 0x38) / *(uint *)(in_RDI + 0x3c);
      local_60 = local_60 + 1) {
    auVar1 = ZEXT416(*(uint *)(in_RDI + 0x3c)) * ZEXT816(4);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    *(void **)(*(long *)(in_RDI + 0x48) + (ulong)local_60 * 8) = pvVar5;
    for (local_64 = 0; local_64 < *(uint *)(in_RDI + 0x3c); local_64 = local_64 + 1) {
      *(undefined4 *)
       (*(long *)(*(long *)(in_RDI + 0x48) + (ulong)local_60 * 8) + (ulong)local_64 * 4) = 0;
    }
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (ulong)*(uint *)(in_RDI + 0x38) / (ulong)*(uint *)(in_RDI + 0x3c);
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *(void **)(in_RDI + 0x58) = pvVar5;
  for (local_68 = 0; local_68 < *(uint *)(in_RDI + 0x38) / *(uint *)(in_RDI + 0x3c);
      local_68 = local_68 + 1) {
    auVar1 = ZEXT416(*(uint *)(in_RDI + 0x60)) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    *(void **)(*(long *)(in_RDI + 0x58) + (ulong)local_68 * 8) = pvVar5;
    for (local_6c = 0; local_6c < *(uint *)(in_RDI + 0x60); local_6c = local_6c + 1) {
      *(undefined8 *)
       (*(long *)(*(long *)(in_RDI + 0x58) + (ulong)local_68 * 8) + (ulong)local_6c * 8) =
           0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

void Cache::initCache() {
    this->blocks = std::vector<Block>(policy.block_num);
    for (uint32_t i = 0; i < this->blocks.size(); i++) {
        Block &b = this->blocks[i];
        b.size = policy.block_size;
        b.id = i / policy.associativity;
        b.data = std::vector<uint8_t>(b.size);
    }
    this->plru_bit = new int *[this->policy.block_num / this->policy.associativity];
    for (uint32_t i = 0; i < this->policy.block_num / this->policy.associativity; i++) {
        this->plru_bit[i] = new int[this->policy.associativity];
        for (uint32_t j = 0; j < this->policy.associativity; j++) {
            this->plru_bit[i][j] = 0;
        }
    }
    this->mct = new uint64_t *[this->policy.block_num / this->policy.associativity];
    for (uint32_t i = 0; i < this->policy.block_num / this->policy.associativity; i++) {
        this->mct[i] = new uint64_t[this->mct_size];
        for (uint32_t j = 0; j < this->mct_size; j++) {
            this->mct[i][j] = (uint64_t) -1;
        }
    }

}